

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_mapper.cpp
# Opt level: O0

bool __thiscall
icu_63::number::impl::PropertiesAffixPatternProvider::negativeHasMinusSign
          (PropertiesAffixPatternProvider *this)

{
  bool bVar1;
  UErrorCode *pUVar2;
  bool local_52;
  undefined1 local_20 [8];
  ErrorCode localStatus;
  PropertiesAffixPatternProvider *this_local;
  
  localStatus._8_8_ = this;
  ErrorCode::ErrorCode((ErrorCode *)local_20);
  pUVar2 = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)local_20);
  bVar1 = AffixUtils::containsType(&this->negPrefix,TYPE_MINUS_SIGN,pUVar2);
  local_52 = true;
  if (!bVar1) {
    pUVar2 = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)local_20);
    local_52 = AffixUtils::containsType(&this->negSuffix,TYPE_MINUS_SIGN,pUVar2);
  }
  ErrorCode::~ErrorCode((ErrorCode *)local_20);
  return local_52;
}

Assistant:

bool PropertiesAffixPatternProvider::negativeHasMinusSign() const {
    ErrorCode localStatus;
    return AffixUtils::containsType(negPrefix, TYPE_MINUS_SIGN, localStatus) ||
           AffixUtils::containsType(negSuffix, TYPE_MINUS_SIGN, localStatus);
}